

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O0

bool __thiscall
tinyusdz::SkelAnimation::get_translations
          (SkelAnimation *this,
          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vals,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  undefined1 local_70 [8];
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> v;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vals_local;
  SkelAnimation *this_local;
  
  v._ts._28_4_ = tinterp;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
  Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              *)local_70);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
          ::get_value(&this->translations,
                      (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       *)local_70);
  if (bVar1) {
    this_local._7_1_ =
         Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
         ::get((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)local_70,t,vals,v._ts._28_4_);
  }
  else {
    this_local._7_1_ = false;
  }
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
  ~Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
               *)local_70);
  return this_local._7_1_;
}

Assistant:

bool SkelAnimation::get_translations(
    std::vector<value::float3> *vals, const double t,
    const value::TimeSampleInterpolationType tinterp) {
  Animatable<std::vector<value::float3>> v;
  if (translations.get_value(&v)) {
    // Evaluate at time `t` with `tinterp` interpolation
    return v.get(t, vals, tinterp);
  }

  return false;
}